

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::SetMakefile(cmTarget *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  char *pcVar6;
  undefined **ppuVar7;
  _Alloc_hider s;
  cmStringRange cVar8;
  cmBacktraceRange cVar9;
  string configUpper;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  cmListFileBacktrace local_e8;
  allocator local_a1;
  cmTarget *local_a0;
  string local_98;
  string local_78;
  string local_50;
  
  this->Makefile = mf;
  local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"WIN32","");
  bVar3 = cmMakefile::IsOn(mf,(string *)&local_e8);
  local_a0 = this;
  if (bVar3) {
    this->DLLPlatform = true;
  }
  else {
    pcVar1 = this->Makefile;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CYGWIN","");
    bVar3 = cmMakefile::IsOn(pcVar1,&local_98);
    if (bVar3) {
      this->DLLPlatform = true;
    }
    else {
      pcVar1 = this->Makefile;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"MINGW","");
      bVar3 = cmMakefile::IsOn(pcVar1,&local_78);
      local_a0->DLLPlatform = bVar3;
      this = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        this = local_a0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
    operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                    local_e8.Context.Name.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = this->Makefile;
  local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CMAKE_SYSTEM_NAME","");
  pcVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_e8);
  iVar4 = strcmp(pcVar6,"Android");
  this->IsAndroid = iVar4 == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
    operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                    local_e8.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_API","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_API_MIN","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_ARCH","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_STL_TYPE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_SKIP_ANT_STEP","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_PROCESS_MAX","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_PROGUARD","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_PROGUARD_CONFIG_PATH","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_SECURE_PROPS_PATH","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_NATIVE_LIB_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_JAVA_SOURCE_DIR","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_JAR_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_JAR_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_ASSETS_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"INSTALL_NAME_DIR","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)&local_e8,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"INSTALL_RPATH_USE_LINK_PATH","");
    SetPropertyDefault(this,(string *)&local_e8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SKIP_BUILD_RPATH","");
    SetPropertyDefault(this,(string *)&local_e8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"BUILD_WITH_INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)&local_e8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"ARCHIVE_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"LIBRARY_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"RUNTIME_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"COMPILE_PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Fortran_FORMAT","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Fortran_MODULE_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"GNUtoMS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"OSX_ARCHITECTURES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"IOS_INSTALL_COMBINED","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTOMOC","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTOUIC","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTORCC","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTOMOC_MOC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTOUIC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AUTORCC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LINK_DEPENDS_NO_SHARED","")
    ;
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"LINK_INTERFACE_LIBRARIES","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"WIN32_EXECUTABLE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MACOSX_BUNDLE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MACOSX_RPATH","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"NO_SYSTEM_FROM_IMPORTED","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_INCLUDE_WHAT_YOU_USE","")
    ;
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_STANDARD","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_EXTENSIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CXX_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"CXX_INCLUDE_WHAT_YOU_USE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CXX_STANDARD","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CXX_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CXX_EXTENSIONS","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"LINK_SEARCH_START_STATIC","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LINK_SEARCH_END_STATIC","")
    ;
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  cmMakefile::GetConfigurations
            (&local_50,mf,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->TargetTypeValue != UTILITY) &&
     (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length)) {
    s._M_p = local_78._M_dataplus._M_p;
    do {
      cmsys::SystemTools::UpperCase((string *)&local_e8,(string *)s._M_p);
      ppuVar7 = &PTR_anon_var_dwarf_b81f3b_005ca8f8;
      pcVar6 = "ARCHIVE_OUTPUT_DIRECTORY_";
      do {
        if ((local_a0->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar4 = strcmp(pcVar6,"MAP_IMPORTED_CONFIG_"), iVar4 == 0)) {
          std::__cxx11::string::string((string *)&local_98,pcVar6,&local_a1);
          std::__cxx11::string::_M_append
                    ((char *)&local_98,(ulong)local_e8.Context.Name._M_dataplus._M_p);
          SetPropertyDefault(local_a0,&local_98,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        this = local_a0;
        pcVar6 = *ppuVar7;
        ppuVar7 = ppuVar7 + 1;
      } while (pcVar6 != (char *)0x0);
      if ((local_a0->TargetTypeValue != EXECUTABLE) &&
         (local_a0->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&local_98,(string *)s._M_p);
        std::__cxx11::string::append((char *)&local_98);
        SetPropertyDefault(this,&local_98,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
        operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                        local_e8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      s._M_p = s._M_p + 0x20;
    } while (s._M_p != (pointer)local_78._M_string_length);
  }
  cmMakefile::GetBacktrace(&local_e8,this->Makefile);
  std::__cxx11::string::_M_assign((string *)&this->Backtrace);
  (this->Backtrace).Context.Line = local_e8.Context.Line;
  (this->Backtrace).Snapshot.State = local_e8.Snapshot.State;
  (this->Backtrace).Snapshot.Position.Tree = local_e8.Snapshot.Position.Tree;
  (this->Backtrace).Snapshot.Position.Position = local_e8.Snapshot.Position.Position;
  cmListFileBacktrace::~cmListFileBacktrace(&local_e8);
  if (this->IsImportedTarget == false) {
    cVar8 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
               (pcVar2->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar8.Begin._M_current._M_current,
               cVar8.End._M_current._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->IncludeDirectoriesBacktraces,
               (pcVar2->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar9.Begin._M_current._M_current,
               cVar9.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8,&(this->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_e8.Context.Name.field_2._8_8_,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&local_e8.Context.Name._M_string_length);
    cVar8 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar2->CompileOptionsEntries,
               (pcVar2->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar8.Begin._M_current._M_current,
               cVar8.End._M_current._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->CompileOptionsBacktraces,
               (pcVar2->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar9.Begin._M_current._M_current,
               cVar9.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
  }
  TVar5 = this->TargetTypeValue;
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"C_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CXX_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"VISIBILITY_INLINES_HIDDEN","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    TVar5 = this->TargetTypeValue;
    if (TVar5 == EXECUTABLE) {
      local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ANDROID_GUI","");
      SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
        operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                        local_e8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"CROSSCOMPILING_EMULATOR","");
      SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
        operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                        local_e8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ENABLE_EXPORTS","");
      SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
        operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                        local_e8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      TVar5 = this->TargetTypeValue;
    }
  }
  if ((TVar5 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"POSITION_INDEPENDENT_CODE","");
    SetProperty(this,(string *)&local_e8,"True");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    TVar5 = this->TargetTypeValue;
    if (TVar5 == SHARED_LIBRARY) {
      local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"WINDOWS_EXPORT_ALL_SYMBOLS","");
      SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
        operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                        local_e8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      TVar5 = this->TargetTypeValue;
    }
  }
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"POSITION_INDEPENDENT_CODE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  TVar5 = this->TargetTypeValue;
  if (TVar5 == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
    TVar5 = this->TargetTypeValue;
    if (TVar5 == INTERFACE_LIBRARY) goto LAB_003cb317;
  }
  if (TVar5 != UTILITY) {
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"JOB_POOL_COMPILE","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_e8.Context.Name._M_dataplus._M_p = (pointer)&local_e8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"JOB_POOL_LINK","");
    SetPropertyDefault(this,(string *)&local_e8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.Context.Name._M_dataplus._M_p != &local_e8.Context.Name.field_2) {
      operator_delete(local_e8.Context.Name._M_dataplus._M_p,
                      local_e8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
LAB_003cb317:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void cmTarget::SetMakefile(cmMakefile* mf)
{
  // Set our makefile.
  this->Makefile = mf;

  // Check whether this is a DLL platform.
  this->DLLPlatform = (this->Makefile->IsOn("WIN32") ||
                       this->Makefile->IsOn("CYGWIN") ||
                       this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("ANDROID_API", 0);
    this->SetPropertyDefault("ANDROID_API_MIN", 0);
    this->SetPropertyDefault("ANDROID_ARCH", 0);
    this->SetPropertyDefault("ANDROID_STL_TYPE", 0);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", 0);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", 0);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", 0);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", 0);
    this->SetPropertyDefault("INSTALL_NAME_DIR", 0);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("Fortran_FORMAT", 0);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", 0);
    this->SetPropertyDefault("GNUtoMS", 0);
    this->SetPropertyDefault("OSX_ARCHITECTURES", 0);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", 0);
    this->SetPropertyDefault("AUTOMOC", 0);
    this->SetPropertyDefault("AUTOUIC", 0);
    this->SetPropertyDefault("AUTORCC", 0);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", 0);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", 0);
    this->SetPropertyDefault("AUTORCC_OPTIONS", 0);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", 0);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", 0);
    this->SetPropertyDefault("WIN32_EXECUTABLE", 0);
    this->SetPropertyDefault("MACOSX_BUNDLE", 0);
    this->SetPropertyDefault("MACOSX_RPATH", 0);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", 0);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("C_STANDARD", 0);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("C_EXTENSIONS", 0);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("CXX_STANDARD", 0);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("CXX_EXTENSIONS", 0);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", 0);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", 0);
    }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmState::UTILITY)
    {
    const char* configProps[] = {
      "ARCHIVE_OUTPUT_DIRECTORY_",
      "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",
      "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_",
      "MAP_IMPORTED_CONFIG_",
      0};
    for(std::vector<std::string>::iterator ci = configNames.begin();
        ci != configNames.end(); ++ci)
      {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for(const char** p = configProps; *p; ++p)
        {
        if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY
            && strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0)
          {
          continue;
          }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, 0);
        }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if(this->TargetTypeValue != cmState::EXECUTABLE
          && this->TargetTypeValue != cmState::INTERFACE_LIBRARY)
        {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, 0);
        }
      }
    }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported())
    {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
        this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
        this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
          this->Internal->IncludeDirectoriesEntries.end(),
          parentIncludes.begin(), parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
          this->Internal->IncludeDirectoriesBacktraces.end(),
          parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
                                this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
                                this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
                                this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
          this->Internal->CompileOptionsEntries.end(),
          parentOptions.begin(), parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
          this->Internal->CompileOptionsBacktraces.end(),
          parentOptionsBts.begin(), parentOptionsBts.end());
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", 0);
    }

  if(this->TargetTypeValue == cmState::EXECUTABLE)
    {
    this->SetPropertyDefault("ANDROID_GUI", 0);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", 0);
    this->SetPropertyDefault("ENABLE_EXPORTS", 0);
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY
      || this->TargetTypeValue == cmState::MODULE_LIBRARY)
    {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY)
    {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", 0);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", 0);
    }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY)
    {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmState::INTERFACE_LIBRARY targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("JOB_POOL_COMPILE", 0);
    this->SetPropertyDefault("JOB_POOL_LINK", 0);
    }
}